

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

MOB_INDEX_DATA * get_mob_index(int vnum)

{
  int in_EDI;
  MOB_INDEX_DATA *pMobIndex;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  MOB_INDEX_DATA *pMVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  for (pMVar1 = mob_index_hash[in_EDI % 0x400]; pMVar1 != (MOB_INDEX_DATA *)0x0;
      pMVar1 = pMVar1->next) {
    if (pMVar1->vnum == in_EDI) {
      return pMVar1;
    }
  }
  if (!fBootDb) {
    return (MOB_INDEX_DATA *)0x0;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_EDI,in_stack_fffffffffffffff0),(char *)0x0);
  CLogger::Error<int&>
            ((CLogger *)CONCAT44(vnum,in_stack_00000018),(string_view)in_stack_00000020,
             (int *)pMobIndex);
  exit(1);
}

Assistant:

MOB_INDEX_DATA *get_mob_index(int vnum)
{
	MOB_INDEX_DATA *pMobIndex;

	for (pMobIndex = mob_index_hash[vnum % MAX_KEY_HASH]; pMobIndex != nullptr; pMobIndex = pMobIndex->next)
	{
		if (pMobIndex->vnum == vnum)
			return pMobIndex;
	}

	if (fBootDb)
	{
		RS.Logger.Error("Get_mob_index: funky vnum {}.", vnum);
		exit(1);
	}

	return nullptr;
}